

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O1

lzma_ret lzma_lz_encoder_init
                   (lzma_next_coder_conflict13 *next,lzma_allocator *allocator,
                   lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_encoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr_conflict1
                   *lz_init)

{
  uint uVar1;
  _Bool _Var2;
  lzma_ret lVar3;
  lzma_coder_conflict14 *plVar4;
  uint8_t *puVar5;
  uint32_t *puVar6;
  ulong uVar7;
  lzma_lz_options_conflict lz_options;
  lzma_lz_options_conflict lStack_68;
  
  if (next->coder == (lzma_coder_conflict14 *)0x0) {
    plVar4 = (lzma_coder_conflict14 *)lzma_alloc(0xd8,allocator);
    next->coder = plVar4;
    if (plVar4 != (lzma_coder_conflict14 *)0x0) {
      next->code = lz_encode;
      next->end = lz_encoder_end;
      next->update = lz_encoder_update;
      (plVar4->mf).buffer = (uint8_t *)0x0;
      (plVar4->mf).hash = (uint32_t *)0x0;
      (plVar4->mf).hash_size_sum = 0;
      (plVar4->mf).sons_count = 0;
      (plVar4->lz).coder = (lzma_coder_conflict14 *)0x0;
      (plVar4->lz).code =
           (_func_lzma_ret_lzma_coder_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t_conflict1 *)0x0;
      (plVar4->lz).end = (_func_void_lzma_coder_ptr_lzma_allocator_ptr_conflict12 *)0x0;
      (plVar4->next).coder = (lzma_coder_conflict14 *)0x0;
      (plVar4->next).id = 0xffffffffffffffff;
      (plVar4->next).init = 0;
      (plVar4->next).code = (lzma_code_function_conflict12)0x0;
      (plVar4->next).end = (lzma_end_function_conflict12)0x0;
      (plVar4->next).get_check = (_func_lzma_check_lzma_coder_ptr_conflict13 *)0x0;
      (plVar4->next).memconfig =
           (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict13 *)0x0;
      (plVar4->next).update =
           (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict13
            *)0x0;
      goto LAB_004a0fbc;
    }
LAB_004a10f1:
    lVar3 = LZMA_MEM_ERROR;
  }
  else {
LAB_004a0fbc:
    lVar3 = (*lz_init)(&next->coder->lz,allocator,filters->options,&lStack_68);
    if (lVar3 != LZMA_OK) {
      return lVar3;
    }
    _Var2 = lz_encoder_prepare(&next->coder->mf,allocator,&lStack_68);
    if (_Var2) {
      return LZMA_OPTIONS_ERROR;
    }
    plVar4 = next->coder;
    if ((plVar4->mf).buffer == (uint8_t *)0x0) {
      puVar5 = (uint8_t *)lzma_alloc((ulong)(plVar4->mf).size,allocator);
      (plVar4->mf).buffer = puVar5;
      if (puVar5 == (uint8_t *)0x0) goto LAB_004a10f1;
    }
    (plVar4->mf).offset = (plVar4->mf).cyclic_size;
    (plVar4->mf).read_pos = 0;
    (plVar4->mf).read_ahead = 0;
    (plVar4->mf).read_limit = 0;
    (plVar4->mf).write_pos = 0;
    (plVar4->mf).pending = 0;
    if ((plVar4->mf).hash == (uint32_t *)0x0) {
      puVar6 = (uint32_t *)
               lzma_alloc((ulong)((plVar4->mf).sons_count + (plVar4->mf).hash_size_sum) << 2,
                          allocator);
      (plVar4->mf).hash = puVar6;
      if (puVar6 == (uint32_t *)0x0) goto LAB_004a10f1;
    }
    puVar6 = (plVar4->mf).hash;
    uVar7 = (ulong)(plVar4->mf).hash_size_sum;
    (plVar4->mf).son = puVar6 + uVar7;
    (plVar4->mf).cyclic_pos = 0;
    memset(puVar6,0,uVar7 << 2);
    if ((lStack_68.preset_dict != (uint8_t *)0x0) && ((ulong)lStack_68.preset_dict_size != 0)) {
      uVar1 = (plVar4->mf).size;
      if (lStack_68.preset_dict_size < uVar1) {
        uVar1 = lStack_68.preset_dict_size;
      }
      (plVar4->mf).write_pos = uVar1;
      memcpy((plVar4->mf).buffer,
             lStack_68.preset_dict + ((ulong)lStack_68.preset_dict_size - (ulong)uVar1),(ulong)uVar1
            );
      (plVar4->mf).action = LZMA_SYNC_FLUSH;
      (*(plVar4->mf).skip)(&plVar4->mf,(plVar4->mf).write_pos);
    }
    (plVar4->mf).action = LZMA_RUN;
    lVar3 = lzma_next_filter_init((lzma_next_coder *)&next->coder->next,allocator,filters + 1);
  }
  return lVar3;
}

Assistant:

static bool
lz_encoder_init(lzma_mf *mf, lzma_allocator *allocator,
		const lzma_lz_options *lz_options)
{
	size_t alloc_count;

	// Allocate the history buffer.
	if (mf->buffer == NULL) {
		mf->buffer = lzma_alloc(mf->size, allocator);
		if (mf->buffer == NULL)
			return true;
	}

	// Use cyclic_size as initial mf->offset. This allows
	// avoiding a few branches in the match finders. The downside is
	// that match finder needs to be normalized more often, which may
	// hurt performance with huge dictionaries.
	mf->offset = mf->cyclic_size;
	mf->read_pos = 0;
	mf->read_ahead = 0;
	mf->read_limit = 0;
	mf->write_pos = 0;
	mf->pending = 0;

	// Allocate match finder's hash array.
	alloc_count = mf->hash_size_sum + mf->sons_count;

#if UINT32_MAX >= SIZE_MAX / 4
	// Check for integer overflow. (Huge dictionaries are not
	// possible on 32-bit CPU.)
	if (alloc_count > SIZE_MAX / sizeof(uint32_t))
		return true;
#endif

	if (mf->hash == NULL) {
		mf->hash = lzma_alloc(alloc_count * sizeof(uint32_t),
				allocator);
		if (mf->hash == NULL)
			return true;
	}

	mf->son = mf->hash + mf->hash_size_sum;
	mf->cyclic_pos = 0;

	// Initialize the hash table. Since EMPTY_HASH_VALUE is zero, we
	// can use memset().
/*
	for (uint32_t i = 0; i < hash_size_sum; ++i)
		mf->hash[i] = EMPTY_HASH_VALUE;
*/
	memzero(mf->hash, (size_t)(mf->hash_size_sum) * sizeof(uint32_t));

	// We don't need to initialize mf->son, but not doing that will
	// make Valgrind complain in normalization (see normalize() in
	// lz_encoder_mf.c).
	//
	// Skipping this initialization is *very* good when big dictionary is
	// used but only small amount of data gets actually compressed: most
	// of the mf->hash won't get actually allocated by the kernel, so
	// we avoid wasting RAM and improve initialization speed a lot.
	//memzero(mf->son, (size_t)(mf->sons_count) * sizeof(uint32_t));

	// Handle preset dictionary.
	if (lz_options->preset_dict != NULL
			&& lz_options->preset_dict_size > 0) {
		// If the preset dictionary is bigger than the actual
		// dictionary, use only the tail.
		mf->write_pos = my_min(lz_options->preset_dict_size, mf->size);
		memcpy(mf->buffer, lz_options->preset_dict
				+ lz_options->preset_dict_size - mf->write_pos,
				mf->write_pos);
		mf->action = LZMA_SYNC_FLUSH;
		mf->skip(mf, mf->write_pos);
	}

	mf->action = LZMA_RUN;

	return false;
}